

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *__return_storage_ptr__,string *line,string *delim)

{
  long lVar1;
  string local_70 [39];
  undefined1 local_49;
  string local_48 [8];
  string token;
  size_t pos;
  string *delim_local;
  string *line_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *row;
  
  std::__cxx11::string::string(local_48);
  local_49 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  while (lVar1 = std::__cxx11::string::find((string *)line,(ulong)delim), lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_70,(ulong)line);
    std::__cxx11::string::operator=(local_48,local_70);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::length();
    std::__cxx11::string::erase((ulong)line,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_48);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,line);
  local_49 = 1;
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> split (std::string line, std::string delim)
{

    size_t pos = 0;
    std::string token;
    std::vector <std::string> row;
    while ((pos = line.find(delim)) != std::string::npos) {

        token = line.substr(0, pos);
        line.erase(0, pos + delim.length());
        row.push_back(token);
    }
    row.push_back(line);
    return row;
}